

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O1

void CLineInput::RenderCandidates(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ITextRender *pIVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ulong uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  vec2 vVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  CTextBoundingBox CVar17;
  char aBuf [8];
  float local_8c;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x12])();
  if ((char)iVar4 != '\0') {
    iVar4 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x17])();
    if (iVar4 != 0) {
      uVar1 = s_pGraphics->m_ScreenWidth;
      uVar2 = s_pGraphics->m_ScreenHeight;
      fVar13 = (float)(int)uVar2;
      fVar16 = ((float)(int)uVar1 / fVar13) * 300.0;
      local_8c = 0.0;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[5])();
      if (RenderCandidates()::s_CandidateCursor == '\0') {
        iVar4 = __cxa_guard_acquire(&RenderCandidates()::s_CandidateCursor);
        if (iVar4 != 0) {
          CTextCursor::CTextCursor(&RenderCandidates::s_CandidateCursor);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderCandidates::s_CandidateCursor,&__dso_handle)
          ;
          __cxa_guard_release(&RenderCandidates()::s_CandidateCursor);
        }
      }
      CTextCursor::Reset(&RenderCandidates::s_CandidateCursor,-1);
      RenderCandidates::s_CandidateCursor.m_FontSize = 7.0;
      RenderCandidates::s_CandidateCursor.m_MaxLines = -1;
      RenderCandidates::s_CandidateCursor.m_LineSpacing = 2.45;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = s_CompositionWindowPosition.field_0;
      auVar9._4_4_ = s_CompositionWindowPosition.field_1;
      auVar10._4_4_ = fVar13;
      auVar10._0_4_ = (float)(int)uVar1;
      auVar10._8_8_ = 0;
      auVar10 = divps(auVar9,auVar10);
      fVar11 = fVar16 * auVar10._0_4_;
      fVar14 = auVar10._4_4_ * 300.0;
      iVar4 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x17])();
      if (0 < iVar4) {
        local_8c = 0.0;
        uVar6 = 1;
        uVar7 = 0;
        do {
          uVar5 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x18])();
          if (uVar7 == uVar5) {
            local_8c = RenderCandidates::s_CandidateCursor.m_Height;
          }
          if (uVar7 != 0) {
            (*(s_pTextRender->super_IInterface)._vptr_IInterface[8])
                      (s_pTextRender,&RenderCandidates::s_CandidateCursor);
          }
          uVar5 = uVar7 + 1;
          str_format((char *)&local_48,8,"%d. ",(ulong)((int)(uVar6 / 10) * -10 + 1 + uVar7));
          (*(s_pTextRender->super_IInterface)._vptr_IInterface[4])();
          (*(s_pTextRender->super_IInterface)._vptr_IInterface[7])
                    (s_pTextRender,&RenderCandidates::s_CandidateCursor,&local_48,0xffffffff);
          (*(s_pTextRender->super_IInterface)._vptr_IInterface[4])();
          pIVar3 = s_pTextRender;
          iVar4 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x16])(s_pInput,(ulong)uVar7);
          (*(pIVar3->super_IInterface)._vptr_IInterface[7])
                    (pIVar3,&RenderCandidates::s_CandidateCursor,CONCAT44(extraout_var,iVar4),
                     0xffffffff);
          iVar4 = (*(s_pInput->super_IInterface)._vptr_IInterface[0x17])();
          uVar6 = (ulong)((int)uVar6 + 1);
          uVar7 = uVar5;
        } while ((int)uVar5 < iVar4);
      }
      CVar17 = CTextCursor::AlignedBoundingBox(&RenderCandidates::s_CandidateCursor);
      fVar12 = CVar17.w + 8.0;
      fVar15 = CVar17.h + 4.0;
      if (300.0 < fVar14 + 94.5) {
        fVar14 = fVar14 - ((s_CompositionLineHeight / fVar13) * 300.0 + fVar15);
      }
      fVar13 = fVar12 + fVar11 + 8.0;
      if (fVar16 < fVar13) {
        fVar11 = fVar11 - (fVar13 - fVar16);
      }
      vVar8.field_0.x = fVar11 + 4.0;
      vVar8.field_1.y = fVar14 + 2.0;
      RenderCandidates::s_CandidateCursor.m_CursorPos = vVar8;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffff);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[8])();
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      local_48 = CONCAT44(fVar14 + 0.75,fVar11 + 0.75);
      uStack_40 = CONCAT44(fVar15,fVar12);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_48,1);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      local_48 = CONCAT44(fVar14,fVar11);
      uStack_40 = CONCAT44(fVar15,fVar12);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_48,1);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      local_48 = CONCAT44(local_8c + vVar8.field_1.y,fVar11 + 2.0);
      uStack_40 = CONCAT44(0x41173333,fVar12 + -4.0);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_48,1);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
      (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x10])
                (s_pTextRender,&RenderCandidates::s_CandidateCursor,0,0xffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLineInput::RenderCandidates()
{
	if(!s_pInput->HasComposition() || !s_pInput->GetCandidateCount())
		return;

	const float FontSize = 7.0f;
	const float HMargin = 8.0f;
	const float VMargin = 4.0f;
	const float Height = 300;
	const float Width = Height*s_pGraphics->ScreenAspect();
	const int ScreenWidth = s_pGraphics->ScreenWidth();
	const int ScreenHeight = s_pGraphics->ScreenHeight();

	s_pGraphics->MapScreen(0, 0, Width, Height);

	static CTextCursor s_CandidateCursor;
	s_CandidateCursor.Reset();
	s_CandidateCursor.m_FontSize = FontSize;
	s_CandidateCursor.m_LineSpacing = FontSize*0.35f;
	s_CandidateCursor.m_MaxLines = -1;

	vec2 Position = s_CompositionWindowPosition / vec2(ScreenWidth, ScreenHeight) * vec2(Width, Height);
	float SelectedCandidateY = 0;
	for(int i = 0; i < s_pInput->GetCandidateCount(); ++i)
	{
		if(i == s_pInput->GetCandidateSelectedIndex())
			SelectedCandidateY = s_CandidateCursor.Height();

		if(i > 0)
			s_pTextRender->TextNewline(&s_CandidateCursor);

		char aBuf[8];
		str_format(aBuf, sizeof(aBuf), "%d. ", (i+1)%10);

		s_pTextRender->TextColor(0.6f, 0.6f, 0.6f, 1.0f);
		s_pTextRender->TextDeferred(&s_CandidateCursor, aBuf, -1);
		s_pTextRender->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
		s_pTextRender->TextDeferred(&s_CandidateCursor, s_pInput->GetCandidate(i), -1);
	}

	CTextBoundingBox BoundingBox = s_CandidateCursor.BoundingBox();
	BoundingBox.x = Position.x;
	BoundingBox.y = Position.y;
	BoundingBox.w += HMargin;
	BoundingBox.h += VMargin;

	// move candidate window up if needed
	if(BoundingBox.y + FontSize * 13.5f > Height)
		BoundingBox.y -= BoundingBox.h + s_CompositionLineHeight / ScreenHeight * Height;

	// move candidate window left if needed
	if(BoundingBox.x + BoundingBox.w + HMargin > Width)
		BoundingBox.x -= BoundingBox.x + BoundingBox.w + HMargin - Width;

	s_CandidateCursor.MoveTo(vec2(BoundingBox.x+HMargin/2, BoundingBox.y+VMargin/2));

	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();
	s_pGraphics->BlendNormal();

	// window shadow
	s_pGraphics->SetColor(0.0f, 0.0f, 0.0f, 0.8f);
	IGraphics::CQuadItem Quad = IGraphics::CQuadItem(BoundingBox.x+0.75f, BoundingBox.y+0.75f, BoundingBox.w, BoundingBox.h);
	s_pGraphics->QuadsDrawTL(&Quad, 1);

	// window background
	s_pGraphics->SetColor(0.15f, 0.15f, 0.15f, 1.0f);
	Quad = IGraphics::CQuadItem(BoundingBox.x, BoundingBox.y, BoundingBox.w, BoundingBox.h);
	s_pGraphics->QuadsDrawTL(&Quad, 1);

	// highlight
	s_pGraphics->SetColor(0.1f, 0.4f, 0.8f, 1.0f);
	Quad = IGraphics::CQuadItem(BoundingBox.x+HMargin/4, BoundingBox.y+VMargin/2+SelectedCandidateY, BoundingBox.w-HMargin/2, FontSize*1.35f);
	s_pGraphics->QuadsDrawTL(&Quad, 1);
	s_pGraphics->QuadsEnd();

	s_pTextRender->DrawTextOutlined(&s_CandidateCursor);
}